

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool google::protobuf::FileDescriptorSet::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  FileDescriptorSet *extendee;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *t;
  FileDescriptorSet *this_;
  MessageLite *msg_local;
  
  extendee = default_instance();
  bVar1 = internal::ExtensionSet::IsInitialized((ExtensionSet *)(msg + 1),(MessageLite *)extendee);
  if (bVar1) {
    t = _internal_file((FileDescriptorSet *)msg);
    bVar1 = internal::AllAreInitialized<google::protobuf::FileDescriptorProto>(t);
    if (bVar1) {
      msg_local._7_1_ = true;
    }
    else {
      msg_local._7_1_ = false;
    }
  }
  else {
    msg_local._7_1_ = false;
  }
  return msg_local._7_1_;
}

Assistant:

PROTOBUF_NOINLINE bool FileDescriptorSet::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const FileDescriptorSet&>(msg);
  if (!this_._impl_._extensions_.IsInitialized(&default_instance())) {
    return false;
  }
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_file()))
    return false;
  return true;
}